

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.hpp
# Opt level: O2

void __thiscall
BCL::
read<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>>
          (BCL *this,
          GlobalPtr<const_BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
          src,HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
              *dst,size_t size)

{
  debug_error *pdVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  MPI_Request request;
  
  if (my_nprocs < this) {
    pdVar1 = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string((string *)&request,(unsigned_long)this);
    std::operator+(&bStack_78,"BCL read(): request to read from rank ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&request);
    std::operator+(&local_58,&bStack_78,", which does not exist");
    debug_error::debug_error(pdVar1,&local_58);
    __cxa_throw(pdVar1,&debug_error::typeinfo,debug_error::~debug_error);
  }
  iVar2 = (int)dst << 5;
  iVar2 = MPI_Rget(src.ptr,iVar2,&ompi_mpi_char,(ulong)this & 0xffffffff,src.rank,iVar2,
                   &ompi_mpi_char,win,&request);
  if (iVar2 == 0) {
    iVar2 = MPI_Wait(&request,0);
    if (iVar2 == 0) {
      return;
    }
    pdVar1 = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string(&bStack_78,iVar2);
    std::operator+(&local_58,"BCL read(): MPI_Wait returned error code ",&bStack_78);
    debug_error::debug_error(pdVar1,&local_58);
    __cxa_throw(pdVar1,&debug_error::typeinfo,debug_error::~debug_error);
  }
  pdVar1 = (debug_error *)__cxa_allocate_exception(0x40);
  std::__cxx11::to_string(&bStack_78,iVar2);
  std::operator+(&local_58,"BCL read(): MPI_Rget returned error code ",&bStack_78);
  debug_error::debug_error(pdVar1,&local_58);
  __cxa_throw(pdVar1,&debug_error::typeinfo,debug_error::~debug_error);
}

Assistant:

inline void read(GlobalPtr<std::add_const_t<T>> src, T *dst, std::size_t size) {
  BCL_DEBUG(
    if (src.rank > BCL::backend::nprocs()) {
      throw debug_error("BCL read(): request to read from rank " +
                        std::to_string(src.rank) + ", which does not exist");
    }
  )
  /*
  if (src.rank == BCL::rank()) {
    std::memcpy(dst, src.local(), size*sizeof(T));
  } else {
    MPI_Request request;
    MPI_Rget(dst, size*sizeof(T), MPI_CHAR, src.rank, src.ptr, size*sizeof(T),
      MPI_CHAR, BCL::win, &request);
    MPI_Wait(&request, MPI_STATUS_IGNORE);
  }
  */
  MPI_Request request;

  int error_code = MPI_Rget(dst, size*sizeof(T), MPI_CHAR,
                            src.rank, src.ptr, size*sizeof(T), MPI_CHAR,
                            BCL::win, &request);
  BCL_DEBUG(
    if (error_code != MPI_SUCCESS) {
      throw debug_error("BCL read(): MPI_Rget returned error code " + std::to_string(error_code));
    }
  )

  error_code = MPI_Wait(&request, MPI_STATUS_IGNORE);
  BCL_DEBUG(
    if (error_code != MPI_SUCCESS) {
      throw debug_error("BCL read(): MPI_Wait returned error code " + std::to_string(error_code));
    }
  )
}